

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_back.hpp
# Opt level: O0

type * __thiscall
sl::functional::detail::
call_bind_back<sl::nullables::detail::and_then_caller_fn_const&,std::tuple<CATCH2_INTERNAL_TEST_30()::__0>const&,std::optional<int>>
          (type *__return_storage_ptr__,detail *this,and_then_caller_fn *func,
          tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_tests_nullables_algorithm_cpp:184:20)>
          *boundArgsTuple,optional<int> *callArgs)

{
  anon_class_16_2_27d33730 local_38;
  tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_tests_nullables_algorithm_cpp:184:20)>
  *local_28;
  optional<int> *callArgs_local;
  tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_tests_nullables_algorithm_cpp:184:20)>
  *boundArgsTuple_local;
  and_then_caller_fn *func_local;
  
  local_38.func = (and_then_caller_fn *)this;
  local_38.callArgs = (optional<int> *)boundArgsTuple;
  local_28 = boundArgsTuple;
  callArgs_local = (optional<int> *)func;
  boundArgsTuple_local =
       (tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_tests_nullables_algorithm_cpp:184:20)>
        *)this;
  func_local = (and_then_caller_fn *)__return_storage_ptr__;
  std::
  apply_abi_cxx11_<sl::functional::detail::call_bind_back<sl::nullables::detail::and_then_caller_fn_const&,std::tuple<CATCH2_INTERNAL_TEST_30()::__0>const&,std::optional<int>>(sl::nullables::detail::and_then_caller_fn_const&,std::tuple<CATCH2_INTERNAL_TEST_30()::__0>const&,std::optional<int>&&)::_lambda<typename____T0>((_T0&&)___)_1_,std::tuple<CATCH2_INTERNAL_TEST_30()::__0>const&>
            (__return_storage_ptr__,&local_38,
             (tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_tests_nullables_algorithm_cpp:184:20)>
              *)func);
  return __return_storage_ptr__;
}

Assistant:

constexpr decltype(auto) call_bind_back(Fn&& func, BoundArgsTuple&& boundArgsTuple, CallArgs&&... callArgs)
	{
		return std::apply(
			[&]<class... TArgs>(TArgs&&... boundArgs) -> decltype(auto)
			{
				return std::invoke(
					std::forward<Fn>(func),
					std::forward<CallArgs>(callArgs)...,
					std::forward<TArgs>(boundArgs)...);
			},
			std::forward<BoundArgsTuple>(boundArgsTuple));
	}